

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

void insert<32000u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_short>,unsigned_short>
               (TrieNode<unsigned_short> *root,uchar **strings,size_t n)

{
  _WordT *p_Var1;
  ushort uVar2;
  size_t sVar3;
  TrieNode<unsigned_short> *pTVar4;
  byte bVar5;
  TrieNode<unsigned_short> *pTVar6;
  size_t depth;
  vector_brodnik<unsigned_char_*> *pvVar7;
  ulong uVar8;
  BurstSimple<unsigned_short> local_61;
  vector_brodnik<unsigned_char_*> *local_60;
  uchar *str;
  TrieNode<unsigned_short> *local_50;
  uchar **local_48;
  size_t local_40;
  size_t local_38;
  
  local_38 = 0;
  local_50 = root;
  local_48 = strings;
  local_40 = n;
  do {
    if (local_38 == local_40) {
      return;
    }
    str = local_48[local_38];
    uVar2 = get_char<unsigned_short>(str,0);
    depth = 2;
    pTVar6 = local_50;
    while( true ) {
      uVar8 = (ulong)uVar2;
      bVar5 = (byte)uVar2;
      if (((pTVar6->is_trie).super__Base_bitset<1024UL>._M_w[uVar2 >> 6] >> (uVar8 & 0x3f) & 1) == 0
         ) break;
      if (bVar5 == 0) {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                      ,0xdf,
                      "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 32000U, BucketT = vector_brodnik<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                     );
      }
      pTVar6 = (TrieNode<unsigned_short> *)(pTVar6->buckets)._M_elems[uVar8];
      uVar2 = get_char<unsigned_short>(str,depth);
      depth = depth + 2;
    }
    pvVar7 = (vector_brodnik<unsigned_char_*> *)(pTVar6->buckets)._M_elems[uVar8];
    if (pvVar7 == (vector_brodnik<unsigned_char_*> *)0x0) {
      local_60 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
      vector_brodnik<unsigned_char_*>::vector_brodnik(local_60);
      (pTVar6->buckets)._M_elems[uVar8] = local_60;
      pvVar7 = local_60;
    }
    local_60 = pvVar7;
    vector_brodnik<unsigned_char_*>::push_back(pvVar7,&str);
    if (bVar5 != 0) {
      sVar3 = vector_brodnik<unsigned_char_*>::size(local_60);
      if (32000 < sVar3) {
        pTVar4 = BurstSimple<unsigned_short>::operator()(&local_61,local_60,depth);
        pvVar7 = local_60;
        (pTVar6->buckets)._M_elems[uVar8] = pTVar4;
        p_Var1 = (pTVar6->is_trie).super__Base_bitset<1024UL>._M_w + (uVar2 >> 6);
        *p_Var1 = *p_Var1 | 1L << (bVar5 & 0x3f);
        vector_brodnik<unsigned_char_*>::~vector_brodnik(local_60);
        operator_delete(pvVar7);
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static inline void
insert(TrieNode<CharT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT>* node = root;
		while (node->is_trie[c]) {
			assert(not is_end(c));
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = static_cast<BucketT*>(node->buckets[c]);
		if (not bucket) {
			node->buckets[c] = bucket = new BucketT;
		}
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			node->is_trie[c] = true;
			delete bucket;
		}
	}
}